

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O1

void __thiscall QString::QString(QString *this,char *ch)

{
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  qsizetype qVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (ch == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar7 = (storage_type *)0xffffffffffffffff;
    do {
      psVar8 = psVar7 + 1;
      pcVar1 = ch + 1 + (long)psVar7;
      psVar7 = psVar8;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar8;
  QVar9.m_size = (qsizetype)&local_38;
  ::QString::fromUtf8(QVar9);
  qVar6 = local_28;
  uVar2 = (undefined4)local_38;
  uVar3 = local_38._4_4_;
  uVar4 = (undefined4)uStack_30;
  uVar5 = uStack_30._4_4_;
  local_38 = 0;
  uStack_30 = 0;
  *(undefined4 *)&(this->d).d = uVar2;
  *(undefined4 *)((long)&(this->d).d + 4) = uVar3;
  *(undefined4 *)&(this->d).ptr = uVar4;
  *(undefined4 *)((long)&(this->d).ptr + 4) = uVar5;
  local_28 = 0;
  (this->d).size = qVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QT_ASCII_CAST_WARN inline QString(const char *ch)
        : QString(fromUtf8(ch))
    {}